

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warped_motion.c
# Opt level: O0

void av1_warp_plane(WarpedMotionParams *wm,int use_hbd,int bd,uint8_t *ref,int width,int height,
                   int stride,uint8_t *pred,int p_col,int p_row,int p_width,int p_height,
                   int p_stride,int subsampling_x,int subsampling_y,ConvolveParams *conv_params)

{
  uint8_t *unaff_RBP;
  int in_ESI;
  uint8_t *unaff_R13;
  undefined8 unaff_R14;
  uint16_t *unaff_R15;
  int unaff_retaddr;
  int unaff_retaddr_00;
  uint16_t *in_stack_00000008;
  WarpedMotionParams *in_stack_00000010;
  int in_stack_00000040;
  int in_stack_00000068;
  int in_stack_00000070;
  int in_stack_00000078;
  undefined4 in_stack_0000007c;
  int in_stack_00000080;
  int in_stack_00000088;
  ConvolveParams *in_stack_00000090;
  
  if (in_ESI == 0) {
    warp_plane((WarpedMotionParams *)CONCAT44(unaff_retaddr_00,unaff_retaddr),unaff_RBP,
               (int)((ulong)unaff_R15 >> 0x20),(int)unaff_R15,(int)((ulong)unaff_R14 >> 0x20),
               unaff_R13,in_stack_00000040,height,(int)ref,bd,(int)wm,in_stack_00000068,
               in_stack_00000070,(ConvolveParams *)CONCAT44(in_stack_0000007c,in_stack_00000078));
  }
  else {
    highbd_warp_plane(in_stack_00000010,in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
                      (int)((ulong)unaff_RBP >> 0x20),unaff_R15,(int)ref,bd,(int)wm,
                      in_stack_00000068,in_stack_00000070,in_stack_00000078,in_stack_00000080,
                      in_stack_00000088,in_stack_00000090);
  }
  return;
}

Assistant:

void av1_warp_plane(WarpedMotionParams *wm, int use_hbd, int bd,
                    const uint8_t *ref, int width, int height, int stride,
                    uint8_t *pred, int p_col, int p_row, int p_width,
                    int p_height, int p_stride, int subsampling_x,
                    int subsampling_y, ConvolveParams *conv_params) {
#if CONFIG_AV1_HIGHBITDEPTH
  if (use_hbd)
    highbd_warp_plane(wm, CONVERT_TO_SHORTPTR(ref), width, height, stride,
                      CONVERT_TO_SHORTPTR(pred), p_col, p_row, p_width,
                      p_height, p_stride, subsampling_x, subsampling_y, bd,
                      conv_params);
  else
    warp_plane(wm, ref, width, height, stride, pred, p_col, p_row, p_width,
               p_height, p_stride, subsampling_x, subsampling_y, conv_params);
#else
  (void)use_hbd;
  (void)bd;
  warp_plane(wm, ref, width, height, stride, pred, p_col, p_row, p_width,
             p_height, p_stride, subsampling_x, subsampling_y, conv_params);
#endif
}